

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

TonkFile tonk_file_from_disk(TonkConnection connection,uint32_t channel,char *name,char *filepath)

{
  char *in_RCX;
  char *in_RDX;
  uint32_t in_ESI;
  TonkConnection in_RDI;
  TonkFile local_8;
  
  if (fp_tonk_file_from_disk == (fp_tonk_file_from_disk_t)0x0) {
    local_8 = (TonkFile)0x0;
  }
  else {
    local_8 = (*fp_tonk_file_from_disk)(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

TonkFile tonk_file_from_disk(
    TonkConnection connection,  ///< Connection to send on
    uint32_t          channel,  ///< Reliable channel for data
    const char*          name,  ///< Transfer name
    const char*      filepath   ///< Path for file to send
)
{
    if (!fp_tonk_file_from_disk) {
        return 0;
    }

    return fp_tonk_file_from_disk(
        connection,
        channel,
        name,
        filepath);
}